

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ManAppendBuf(Gia_Man_t *p,int iLit)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  ulong uVar3;
  
  pObj = Gia_ManAppendObj(p);
  if (-1 < iLit) {
    iVar1 = Abc_Lit2Var(iLit);
    if (iVar1 < p->nObjs) {
      iVar1 = Gia_ObjId(p,pObj);
      iVar2 = Abc_Lit2Var(iLit);
      uVar3 = (ulong)(iVar1 - iVar2 & 0x1fffffff);
      *(ulong *)pObj =
           (ulong)((iLit & 1U) << 0x1d) |
           (ulong)(iLit & 1U) << 0x3d | *(ulong *)pObj & 0xc0000000c0000000 | uVar3 << 0x20 | uVar3;
      p->nBufs = p->nBufs + 1;
      iVar1 = Gia_ObjId(p,pObj);
      return iVar1 * 2;
    }
  }
  __assert_fail("iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x30c,"int Gia_ManAppendBuf(Gia_Man_t *, int)");
}

Assistant:

static inline int Gia_ManAppendBuf( Gia_Man_t * p, int iLit )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p) );
    pObj->iDiff0  = pObj->iDiff1  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit);
    pObj->fCompl0 = pObj->fCompl1 = Abc_LitIsCompl(iLit);
    p->nBufs++;
    return Gia_ObjId( p, pObj ) << 1;
}